

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall
AActor::TakeInventory
          (AActor *this,PClassActor *itemclass,int amount,bool fromdecorate,bool notakeinfinite)

{
  bool bVar1;
  uint uVar2;
  AInventory *this_00;
  bool result;
  AInventory *item;
  bool notakeinfinite_local;
  bool fromdecorate_local;
  int amount_local;
  PClassActor *itemclass_local;
  AActor *this_local;
  
  if (amount < 1) {
    amount = -amount;
  }
  this_00 = FindInventory(this,itemclass,false);
  if (this_00 == (AInventory *)0x0) {
    this_local._7_1_ = false;
  }
  else if (fromdecorate) {
    this_local._7_1_ = 0 < this_00->Amount;
    bVar1 = DObject::IsKindOf((DObject *)this_00,AHexenArmor::RegistrationInfo.MyClass);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if ((notakeinfinite) &&
            (((uVar2 = FIntCVar::operator_cast_to_int(&dmflags), (uVar2 & 0x800) != 0 ||
              ((this->player != (player_t *)0x0 && ((this->player->cheats & 0x800000U) != 0)))) &&
             (bVar1 = DObject::IsKindOf((DObject *)this_00,AAmmo::RegistrationInfo.MyClass), bVar1))
            )) {
      this_local._7_1_ = false;
    }
    else if ((amount == 0) || (this_00->Amount <= amount)) {
      (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])();
    }
    else {
      this_00->Amount = this_00->Amount - amount;
    }
  }
  else {
    this_00->Amount = this_00->Amount - amount;
    if (this_00->Amount < 1) {
      (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])();
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::TakeInventory(PClassActor *itemclass, int amount, bool fromdecorate, bool notakeinfinite)
{
	amount = abs(amount);
	AInventory *item = FindInventory(itemclass);

	if (item == NULL)
		return false;

	if (!fromdecorate)
	{
		item->Amount -= amount;
		if (item->Amount <= 0)
		{
			item->DepleteOrDestroy();
		}
		// It won't be used in non-decorate context, so return false here
		return false;
	}

	bool result = false;
	if (item->Amount > 0)
	{
		result = true;
	}

	if (item->IsKindOf(RUNTIME_CLASS(AHexenArmor)))
		return false;

	// Do not take ammo if the "no take infinite/take as ammo depletion" flag is set
	// and infinite ammo is on
	if (notakeinfinite &&
	((dmflags & DF_INFINITE_AMMO) || (player && player->cheats & CF_INFINITEAMMO)) &&
		item->IsKindOf(RUNTIME_CLASS(AAmmo)))
	{
		// Nothing to do here, except maybe res = false;? Would it make sense?
		result = false;
	}
	else if (!amount || amount>=item->Amount)
	{
		item->DepleteOrDestroy();
	}
	else item->Amount-=amount;

	return result;
}